

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::FakeLoaderCallback::load
          (FakeLoaderCallback *this,SchemaLoader *loader,uint64_t id)

{
  uint uVar1;
  uint64_t id_local;
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  unsigned_long local_20;
  
  if (id != 0x4d2) {
    uVar1 = (this->node)._reader.dataSize;
    if (uVar1 < 0x40) {
      _kjCondition.left = 0;
    }
    else {
      _kjCondition.left = *(this->node)._reader.data;
    }
    _kjCondition.result = _kjCondition.left == id;
    _kjCondition.right = &id_local;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    id_local = id;
    if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
      if (uVar1 < 0x40) {
        local_20 = 0;
      }
      else {
        local_20 = *(this->node)._reader.data;
      }
      kj::_::Debug::
      log<char_const(&)[40],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,unsigned_long,unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x11f,ERROR,
                 "\"failed: expected \" \"(node.getId()) == (id)\", _kjCondition, node.getId(), id",
                 (char (*) [40])"failed: expected (node.getId()) == (id)",&_kjCondition,&local_20,
                 _kjCondition.right);
    }
    _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,this->loaded) ^ 1;
    if ((this->loaded != false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x120,ERROR,"\"failed: expected \" \"!(loaded)\", _kjCondition",
                 (char (*) [27])"failed: expected !(loaded)",(DebugExpression<bool> *)&_kjCondition)
      ;
    }
    this->loaded = true;
    SchemaLoader::loadOnce(loader,&this->node);
  }
  return;
}

Assistant:

void load(const SchemaLoader& loader, uint64_t id) const override {
    if (id == 1234) {
      // Magic "not found" ID.
      return;
    }

    EXPECT_EQ(node.getId(), id);
    EXPECT_FALSE(loaded);
    loaded = true;
    loader.loadOnce(node);
  }